

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real.c
# Opt level: O0

void fft_c2r_exec(fft_real_object obj,fft_data *inp,double *oup)

{
  int iVar1;
  fft_data *inp_00;
  fft_data *oup_00;
  double dVar2;
  double dVar3;
  double temp2;
  double temp1;
  int N;
  int N2;
  int i;
  fft_data *coup;
  fft_data *cinp;
  double *oup_local;
  fft_data *inp_local;
  fft_real_object obj_local;
  
  iVar1 = obj->cobj->N;
  inp_00 = (fft_data *)malloc((long)iVar1 << 4);
  oup_00 = (fft_data *)malloc((long)iVar1 << 4);
  for (N = 0; N < iVar1; N = N + 1) {
    dVar2 = -inp[N].im - inp[iVar1 - N].im;
    dVar3 = -inp[iVar1 - N].re + inp[N].re;
    inp_00[N].re = -dVar3 * obj->twiddle2[N].im +
                   dVar2 * obj->twiddle2[N].re + inp[N].re + inp[iVar1 - N].re;
    inp_00[N].im = dVar2 * obj->twiddle2[N].im +
                   dVar3 * obj->twiddle2[N].re + (inp[N].im - inp[iVar1 - N].im);
  }
  fft_exec(obj->cobj,inp_00,oup_00);
  for (N = 0; N < iVar1; N = N + 1) {
    oup[N << 1] = oup_00[N].re;
    oup[N * 2 + 1] = oup_00[N].im;
  }
  free(inp_00);
  free(oup_00);
  return;
}

Assistant:

void fft_c2r_exec(fft_real_object obj,fft_data *inp,fft_type *oup) {
	
	fft_data* cinp;
	fft_data* coup;
	int i,N2,N;
	fft_type temp1,temp2;
	N2 = obj->cobj->N;
	N = N2*2;
	
	cinp = (fft_data*) malloc (sizeof(fft_data) * N2);
	coup = (fft_data*) malloc (sizeof(fft_data) * N2);
	
	for (i = 0; i < N2; ++i) {
		temp1 = -inp[i].im - inp[N2-i].im ;
		temp2 = -inp[N2-i].re + inp[i].re ;
		cinp[i].re = inp[i].re + inp[N2-i].re + (temp1 * obj->twiddle2[i].re) - (temp2 * obj->twiddle2[i].im);
		cinp[i].im = inp[i].im - inp[N2-i].im + (temp2 * obj->twiddle2[i].re) + (temp1 * obj->twiddle2[i].im);
	}
	
	fft_exec(obj->cobj,cinp,coup);
	for (i = 0; i < N2; ++i) {
		oup[2*i] = coup[i].re;
		oup[2*i+1] = coup[i].im;
	}
	free(cinp);
	free(coup);


}